

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroupStamp.hpp
# Opt level: O0

void __thiscall OpenMD::CutoffGroupStamp::~CutoffGroupStamp(CutoffGroupStamp *this)

{
  CutoffGroupStamp *in_RDI;
  
  ~CutoffGroupStamp(in_RDI);
  operator_delete(in_RDI,0x80);
  return;
}

Assistant:

int getMemberAt(int index) { return members_[index]; }